

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSShape * js_new_shape2(JSContext *ctx,JSObject *proto,int hash_size,int prop_size)

{
  int iVar1;
  JSRuntime *pJVar2;
  JSShape *pJVar3;
  list_head *plVar4;
  JSShape **__s;
  ulong uVar5;
  undefined8 *puVar6;
  int iVar7;
  JSShape *pJVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  JSRefCountHeader *p;
  size_t __n;
  
  pJVar2 = ctx->rt;
  if (pJVar2->shape_hash_size < pJVar2->shape_hash_count * 2 + 2) {
    iVar1 = pJVar2->shape_hash_bits;
    iVar7 = iVar1 + 1;
    iVar10 = 1 << ((byte)iVar7 & 0x1f);
    __n = (long)iVar10 << 3;
    __s = (JSShape **)(*(pJVar2->mf).js_malloc)(&pJVar2->malloc_state,__n);
    if (__s != (JSShape **)0x0) {
      uVar9 = 0;
      memset(__s,0,__n);
      uVar5 = (ulong)(uint)pJVar2->shape_hash_size;
      if (pJVar2->shape_hash_size < 1) {
        uVar5 = uVar9;
      }
      for (; uVar9 != uVar5; uVar9 = uVar9 + 1) {
        pJVar8 = pJVar2->shape_hash[uVar9];
        while (pJVar8 != (JSShape *)0x0) {
          pJVar3 = pJVar8->shape_hash_next;
          uVar11 = pJVar8->hash >> (0x1fU - (char)iVar1 & 0x1f);
          pJVar8->shape_hash_next = __s[uVar11];
          __s[uVar11] = pJVar8;
          pJVar8 = pJVar3;
        }
      }
      (*(pJVar2->mf).js_free)(&pJVar2->malloc_state,pJVar2->shape_hash);
      pJVar2->shape_hash_bits = iVar7;
      pJVar2->shape_hash_size = iVar10;
      pJVar2->shape_hash = __s;
    }
  }
  puVar6 = (undefined8 *)js_malloc(ctx,(ulong)(uint)hash_size * 8 + 0x50);
  if (puVar6 == (undefined8 *)0x0) {
    pJVar8 = (JSShape *)0x0;
  }
  else {
    pJVar8 = (JSShape *)(puVar6 + 2);
    *(undefined4 *)(puVar6 + 2) = 1;
    *(undefined1 *)((long)puVar6 + 0x14) = 2;
    plVar4 = (pJVar2->gc_obj_list).prev;
    plVar4->next = (list_head *)(puVar6 + 3);
    puVar6[3] = plVar4;
    puVar6[4] = &pJVar2->gc_obj_list;
    (pJVar2->gc_obj_list).prev = (list_head *)(puVar6 + 3);
    if (proto != (JSObject *)0x0) {
      (proto->field_0).header.ref_count = (proto->field_0).header.ref_count + 1;
    }
    puVar6[9] = proto;
    *puVar6 = 0;
    puVar6[1] = 0;
    *(undefined4 *)(puVar6 + 6) = 3;
    *(int *)((long)puVar6 + 0x34) = hash_size;
    puVar6[7] = 0;
    *(int *)((long)puVar6 + 0x2c) =
         ((int)((ulong)proto >> 0x20) + (int)proto * -0x61c8ffff) * -0x61c8ffff + 0x3c6e0001;
    *(undefined2 *)(puVar6 + 5) = 1;
    js_shape_hash_link(ctx->rt,pJVar8);
  }
  return pJVar8;
}

Assistant:

static no_inline JSShape *js_new_shape2(JSContext *ctx, JSObject *proto,
                                        int hash_size, int prop_size)
{
    JSRuntime *rt = ctx->rt;
    void *sh_alloc;
    JSShape *sh;

    /* resize the shape hash table if necessary */
    if (2 * (rt->shape_hash_count + 1) > rt->shape_hash_size) {
        resize_shape_hash(rt, rt->shape_hash_bits + 1);
    }

    sh_alloc = js_malloc(ctx, get_shape_size(hash_size, prop_size));
    if (!sh_alloc)
        return NULL;
    sh = get_shape_from_alloc(sh_alloc, hash_size);
    sh->header.ref_count = 1;
    add_gc_object(rt, &sh->header, JS_GC_OBJ_TYPE_SHAPE);
    if (proto)
        JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, proto));
    sh->proto = proto;
    memset(prop_hash_end(sh) - hash_size, 0, sizeof(prop_hash_end(sh)[0]) *
           hash_size);
    sh->prop_hash_mask = hash_size - 1;
    sh->prop_size = prop_size;
    sh->prop_count = 0;
    sh->deleted_prop_count = 0;
    
    /* insert in the hash table */
    sh->hash = shape_initial_hash(proto);
    sh->is_hashed = TRUE;
    sh->has_small_array_index = FALSE;
    js_shape_hash_link(ctx->rt, sh);
    return sh;
}